

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O0

Quat4f Quat4f::randomRotation(float u0,float u1,float u2)

{
  undefined1 auVar1 [16];
  float fVar2;
  Quat4f *in_RDI;
  float in_XMM0_Da;
  float x;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  ulong uVar8;
  float in_XMM1_Da;
  ulong uVar9;
  float in_XMM2_Da;
  Quat4f QVar10;
  float w;
  float r;
  float theta;
  float z;
  
  auVar1 = vfmadd213ss_fma(ZEXT416((uint)in_XMM0_Da),ZEXT416((uint)-in_XMM0_Da),
                           SUB6416(ZEXT464(0x3f800000),0));
  dVar3 = sqrt((double)auVar1._0_4_);
  fVar2 = in_XMM2_Da * 3.1415927;
  dVar4 = cos((double)fVar2);
  dVar5 = sin((double)fVar2);
  dVar6 = cos((double)(in_XMM1_Da * 6.2831855));
  x = (float)(dVar5 * dVar6 * (double)(float)dVar3);
  dVar5 = sin((double)fVar2);
  dVar6 = sin((double)(in_XMM1_Da * 6.2831855));
  dVar7 = sin((double)fVar2);
  uVar9 = (ulong)(uint)x;
  uVar8 = (ulong)(uint)(float)dVar4;
  Quat4f(in_RDI,(float)dVar4,x,(float)(dVar5 * dVar6 * (double)(float)dVar3),
         (float)(dVar7 * (double)in_XMM0_Da));
  QVar10.m_elements[2] = (float)(int)uVar9;
  QVar10.m_elements[3] = (float)(int)(uVar9 >> 0x20);
  QVar10.m_elements[0] = (float)(int)uVar8;
  QVar10.m_elements[1] = (float)(int)(uVar8 >> 0x20);
  return (Quat4f)QVar10.m_elements;
}

Assistant:

Quat4f Quat4f::randomRotation( float u0, float u1, float u2 )
{
	float z = u0;
	float theta = static_cast< float >( 2.f * M_PI * u1 );
	float r = sqrt( 1.f - z * z );
	float w = static_cast< float >( M_PI * u2 );

	return Quat4f
	(
		cos( w ),
		sin( w ) * cos( theta ) * r,
		sin( w ) * sin( theta ) * r,
		sin( w ) * z
	);
}